

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_queue.cpp
# Opt level: O3

uint32_t __thiscall
cppnet::BufferQueue::Read(BufferQueue *this,shared_ptr<cppnet::InnerBuffer> *buffer,uint32_t len)

{
  long lVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  uint uVar4;
  uint uVar5;
  long *plVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  element_type *peVar8;
  element_type *peVar9;
  long *plVar10;
  BufferBlock *__tmp_1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  uint32_t uVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var12;
  bool bVar13;
  uint32_t local_64;
  long local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  List<cppnet::BufferBlock> *local_48;
  element_type *local_38;
  
  peVar9 = (buffer->super___shared_ptr<cppnet::InnerBuffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar9 == (element_type *)0x0) {
    return 0;
  }
  local_64 = len;
  if (len == 0) {
    local_64 = (*(this->super_InnerBuffer).super_Buffer._vptr_Buffer[8])();
    if (local_64 == 0) {
      return 0;
    }
    peVar9 = (buffer->super___shared_ptr<cppnet::InnerBuffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (peVar9 != (element_type *)0x0) goto LAB_0010fad3;
  }
  else {
LAB_0010fad3:
    plVar6 = (long *)__dynamic_cast(peVar9,&InnerBuffer::typeinfo,&typeinfo,0);
    if (plVar6 != (long *)0x0) {
      this_00 = (buffer->super___shared_ptr<cppnet::InnerBuffer,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
      goto LAB_0010fb47;
    }
  }
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  plVar6 = (long *)0x0;
LAB_0010fb47:
  plVar10 = (long *)plVar6[7];
  if (plVar10 == (long *)0x0) {
    (**(code **)(*plVar6 + 0x98))(plVar6);
    plVar10 = (long *)plVar6[5];
    lVar1 = plVar6[6];
    if (lVar1 != 0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(lVar1 + 8) = *(int *)(lVar1 + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(lVar1 + 8) = *(int *)(lVar1 + 8) + 1;
      }
    }
    plVar6[7] = (long)plVar10;
    p_Var12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar6[8];
    plVar6[8] = lVar1;
    if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var12);
      plVar10 = (long *)plVar6[7];
    }
  }
  uVar4 = (**(code **)(*plVar10 + 0x58))();
  peVar8 = (this->_buffer_list)._head.
           super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var12 = (this->_buffer_list)._head.
            super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var12->_M_use_count = p_Var12->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var12->_M_use_count = p_Var12->_M_use_count + 1;
    }
  }
  local_48 = &this->_buffer_list;
  uVar11 = 0;
  do {
    p_Var7 = p_Var12;
    if (peVar8 == (element_type *)0x0) break;
    local_58 = plVar6[7];
    local_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar6[8];
    if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_50->_M_use_count = local_50->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_50->_M_use_count = local_50->_M_use_count + 1;
      }
    }
    uVar5 = (*(peVar8->super_InnerBuffer).super_Buffer._vptr_Buffer[0xc])
                      (peVar8,&local_58,(ulong)uVar4);
    if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
    }
    uVar11 = uVar11 + uVar5;
    bVar13 = uVar4 < uVar5;
    uVar4 = uVar4 - uVar5;
    if (bVar13 || uVar4 == 0) {
      if (local_64 <= uVar11) break;
      (**(code **)(*plVar6 + 0x98))(plVar6);
      plVar10 = (long *)plVar6[5];
      lVar1 = plVar6[6];
      if (lVar1 != 0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)(lVar1 + 8) = *(int *)(lVar1 + 8) + 1;
          UNLOCK();
        }
        else {
          *(int *)(lVar1 + 8) = *(int *)(lVar1 + 8) + 1;
        }
      }
      plVar6[7] = (long)plVar10;
      p_Var12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar6[8];
      plVar6[8] = lVar1;
      if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var12);
        plVar10 = (long *)plVar6[7];
      }
      uVar4 = (**(code **)(*plVar10 + 0x58))();
    }
    else {
      peVar2 = (this->_buffer_write).
               super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar8 == peVar2) {
        peVar8 = (peVar2->super_ListSlot<cppnet::BufferBlock>)._next.
                 super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var3 = (peVar2->super_ListSlot<cppnet::BufferBlock>)._next.
                 super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        if (p_Var3 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (peVar8 == (element_type *)0x0) goto LAB_0010fdae;
LAB_0010fd1f:
          p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        }
        else {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          }
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
          if (peVar8 == (element_type *)0x0) {
LAB_0010fdae:
            (*(this->super_InnerBuffer).super_Buffer._vptr_Buffer[0x12])();
            break;
          }
          peVar2 = (this->_buffer_write).
                   super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          peVar8 = (peVar2->super_ListSlot<cppnet::BufferBlock>)._next.
                   super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          p_Var7 = (peVar2->super_ListSlot<cppnet::BufferBlock>)._next.
                   super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
          if (p_Var7 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0010fd1f;
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
          }
        }
        (this->_buffer_write).super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = peVar8;
        p_Var3 = (this->_buffer_write).
                 super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        (this->_buffer_write).super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = p_Var7;
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
        }
      }
      List<cppnet::BufferBlock>::PopFront((List<cppnet::BufferBlock> *)&stack0xffffffffffffffc0);
      if (local_38 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38);
      }
      peVar8 = (this->_buffer_list)._head.
               super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var7 = (this->_buffer_list)._head.
               super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ;
      if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
        }
      }
      if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var12);
      }
    }
    p_Var12 = p_Var7;
  } while (uVar11 < local_64);
  this->_can_read_length = this->_can_read_length - uVar11;
  *(uint32_t *)(plVar6 + 1) = (int)plVar6[1] + uVar11;
  if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return uVar11;
}

Assistant:

uint32_t BufferQueue::Read(std::shared_ptr<InnerBuffer> buffer, uint32_t len) {
    if (!buffer) {
        return 0;
    }
    
    if (len == 0) {
        len = GetCanReadLength();
    } 
    if (len == 0) {
        return 0;
    }

    std::shared_ptr<BufferQueue> buffer_queue = std::dynamic_pointer_cast<BufferQueue>(buffer);
    if (!buffer_queue->_buffer_write) {
        buffer_queue->Append();
        buffer_queue->_buffer_write = buffer_queue->_buffer_list.GetTail();
    }

    uint32_t can_write_size = buffer_queue->_buffer_write->GetCanWriteLength();
    uint32_t total_read_len = 0;
    uint32_t cur_read_len = 0;

    auto buffer_read = _buffer_list.GetHead();
    while (buffer_read) {
        cur_read_len = buffer_read->Read(buffer_queue->_buffer_write, can_write_size);
        total_read_len += cur_read_len;

        // current write block is full
        if (cur_read_len >= can_write_size) {
            if (total_read_len >= len) {
                break;
            }

            buffer_queue->Append();
            buffer_queue->_buffer_write = buffer_queue->_buffer_list.GetTail();
            can_write_size = buffer_queue->_buffer_write->GetCanWriteLength();

        // current read block is empty
        } else {
            can_write_size -= cur_read_len;
            if (buffer_read == _buffer_write) {
                if (_buffer_write->GetNext()) {
                    _buffer_write = _buffer_write->GetNext();

                } else {
                    Reset();
                    break;
                }
            }
            _buffer_list.PopFront();
            buffer_read = _buffer_list.GetHead();
        }

        if (total_read_len >= len) {
            break;
        }
    }
    _can_read_length -= total_read_len;
    buffer_queue->_can_read_length += total_read_len;
    return total_read_len;
}